

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O2

size_t __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::insert
          (SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *this,size_t outerIndex,
          size_t innerIndex,double value)

{
  int *piVar1;
  pointer piVar2;
  pointer piVar3;
  bool bVar4;
  size_t sVar5;
  double *pdVar6;
  size_t nextOuterIndex;
  ulong uVar7;
  size_t insertionIndex;
  size_t local_40;
  double local_38;
  double local_30;
  
  uVar7 = this->m_allocatedSize;
  local_38 = value;
  sVar5 = VectorDynSize::size(&this->m_values);
  if (uVar7 <= sVar5) {
    sVar5 = VectorDynSize::size(&this->m_values);
    reserve(this,sVar5 + 10);
  }
  local_40 = 0;
  bVar4 = valueIndexForOuterAndInnerIndices(this,outerIndex,innerIndex,&local_40);
  if (!bVar4) {
    sVar5 = VectorDynSize::size(&this->m_values);
    VectorDynSize::resize(&this->m_values,sVar5 + 1);
    std::vector<int,_std::allocator<int>_>::resize
              (&this->m_innerIndices,
               ((long)(this->m_innerIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->m_innerIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) + 1);
    sVar5 = VectorDynSize::size(&this->m_values);
    uVar7 = sVar5 - 1;
    while (local_40 < uVar7) {
      pdVar6 = VectorDynSize::operator()(&this->m_values,uVar7 - 1);
      local_30 = *pdVar6;
      pdVar6 = VectorDynSize::operator()(&this->m_values,uVar7);
      *pdVar6 = local_30;
      piVar2 = (this->m_innerIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar2[uVar7] = piVar2[uVar7 - 1];
      uVar7 = uVar7 - 1;
    }
    pdVar6 = VectorDynSize::operator()(&this->m_values,local_40);
    *pdVar6 = local_38;
    (this->m_innerIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[local_40] = (int)innerIndex;
    piVar2 = (this->m_outerStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->m_outerStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (; outerIndex < ((long)piVar3 - (long)piVar2 >> 2) - 1U; outerIndex = outerIndex + 1) {
      piVar1 = piVar2 + outerIndex + 1;
      *piVar1 = *piVar1 + 1;
    }
  }
  return local_40;
}

Assistant:

std::size_t SparseMatrix<ordering>::insert(std::size_t outerIndex, std::size_t innerIndex, double value)
    {
        //first: check if there is space in the arrays
        if (m_allocatedSize <= m_values.size()) {
            reserve(m_values.size() + 10);
        }

        //find insertion position
        std::size_t insertionIndex = 0;
        if (valueIndexForOuterAndInnerIndices(outerIndex, innerIndex, insertionIndex)) {
            //???: what if the element exists alredy in the matrix?
            return insertionIndex;
        }

        //I found the index. Now I have to shift to the right the values and inner elements
        m_values.resize(m_values.size() + 1);
        m_innerIndices.resize(m_innerIndices.size() + 1);

        for (std::size_t i = m_values.size() - 1; i > insertionIndex && i > 0; --i) {
            m_values(i) = m_values(i - 1);
            m_innerIndices[i] = m_innerIndices[i - 1];
        }

        m_values(insertionIndex) = value;
        m_innerIndices[insertionIndex] = innerIndex;
        //update row NNZ
        for (std::size_t nextOuterIndex = outerIndex; nextOuterIndex < m_outerStarts.size() - 1; ++nextOuterIndex) {
            m_outerStarts[nextOuterIndex + 1]++;
        }

        return insertionIndex;
    }